

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_zlib_decode_buffer(char *obuffer,int olen,char *ibuffer,int ilen)

{
  int iVar1;
  undefined1 local_1030 [8];
  stbi__zbuf a;
  int ilen_local;
  char *ibuffer_local;
  int olen_local;
  char *obuffer_local;
  
  a.zbuffer = (stbi_uc *)(ibuffer + ilen);
  local_1030 = (undefined1  [8])ibuffer;
  a._4092_4_ = ilen;
  iVar1 = stbi__do_zlib((stbi__zbuf *)local_1030,obuffer,olen,0,1);
  if (iVar1 == 0) {
    obuffer_local._4_4_ = -1;
  }
  else {
    obuffer_local._4_4_ = a.num_bits - (int)a.zout;
  }
  return obuffer_local._4_4_;
}

Assistant:

STBIDEF int stbi_zlib_decode_buffer(char *obuffer, int olen, char const *ibuffer, int ilen)
{
   stbi__zbuf a;
   a.zbuffer = (stbi_uc *) ibuffer;
   a.zbuffer_end = (stbi_uc *) ibuffer + ilen;
   if (stbi__do_zlib(&a, obuffer, olen, 0, 1))
      return (int) (a.zout - a.zout_start);
   else
      return -1;
}